

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O3

void ylt::metric::detail::stat_io(void)

{
  element_type *peVar1;
  int iVar2;
  string *psVar3;
  ProcIO s;
  shared_ptr<_IO_FILE> stream_file;
  
  if (stat_io()::process_io_read_bytes_second == '\0') {
    iVar2 = __cxa_guard_acquire(&stat_io()::process_io_read_bytes_second);
    if (iVar2 != 0) {
      psVar3 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      s.rchar = (size_t)&s.syscr;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&s,"ylt_process_io_read_bytes_second","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_io::process_io_read_bytes_second,psVar3);
      if ((size_t *)s.rchar != &s.syscr) {
        operator_delete((void *)s.rchar,s.syscr + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_io::process_io_read_bytes_second,&__dso_handle);
      __cxa_guard_release(&stat_io()::process_io_read_bytes_second);
    }
  }
  if (stat_io()::process_io_write_bytes_second == '\0') {
    iVar2 = __cxa_guard_acquire(&stat_io()::process_io_write_bytes_second);
    if (iVar2 != 0) {
      psVar3 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      s.rchar = (size_t)&s.syscr;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&s,"ylt_process_io_write_bytes_second","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_io::process_io_write_bytes_second,psVar3);
      if ((size_t *)s.rchar != &s.syscr) {
        operator_delete((void *)s.rchar,s.syscr + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_io::process_io_write_bytes_second,&__dso_handle);
      __cxa_guard_release(&stat_io()::process_io_write_bytes_second);
    }
  }
  if (stat_io()::process_io_read_second == '\0') {
    iVar2 = __cxa_guard_acquire(&stat_io()::process_io_read_second);
    if (iVar2 != 0) {
      psVar3 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      s.rchar = (size_t)&s.syscr;
      std::__cxx11::string::_M_construct<char_const*>((string *)&s,"ylt_process_io_read_second","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_io::process_io_read_second,psVar3);
      if ((size_t *)s.rchar != &s.syscr) {
        operator_delete((void *)s.rchar,s.syscr + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_io::process_io_read_second,&__dso_handle);
      __cxa_guard_release(&stat_io()::process_io_read_second);
    }
  }
  if (stat_io()::process_io_write_second == '\0') {
    iVar2 = __cxa_guard_acquire(&stat_io()::process_io_write_second);
    if (iVar2 != 0) {
      psVar3 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      s.rchar = (size_t)&s.syscr;
      std::__cxx11::string::_M_construct<char_const*>((string *)&s,"ylt_process_io_write_second","")
      ;
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_io::process_io_write_second,psVar3);
      if ((size_t *)s.rchar != &s.syscr) {
        operator_delete((void *)s.rchar,s.syscr + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_io::process_io_write_second,&__dso_handle);
      __cxa_guard_release(&stat_io()::process_io_write_second);
    }
  }
  s.read_bytes = 0;
  s.write_bytes = 0;
  s.syscr = 0;
  s.syscw = 0;
  s.rchar = 0;
  s.wchar = 0;
  s.cancelled_write_bytes = 0;
  stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fopen("/proc/self/io","r");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<_IO_FILE*,ylt::metric::detail::stat_io()::_lambda(_IO_FILE*)_1_,std::allocator<void>,void>
            (&stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar2 = __isoc99_fscanf(stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,"%*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu",&s,
                            &s.wchar,&s.syscr,&s.syscw,&s.read_bytes,&s.write_bytes,
                            &s.cancelled_write_bytes);
    peVar1 = stat_io::process_io_read_bytes_second.
             super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (iVar2 == 7) {
      if (((stat_io::process_io_read_bytes_second.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((stat_io::process_io_read_bytes_second.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,s.rchar);
      peVar1 = stat_io::process_io_write_bytes_second.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((stat_io::process_io_write_bytes_second.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((stat_io::process_io_write_bytes_second.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,s.wchar);
      peVar1 = stat_io::process_io_read_second.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((stat_io::process_io_read_second.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((stat_io::process_io_read_second.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,s.syscr);
      peVar1 = stat_io::process_io_write_second.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((stat_io::process_io_write_second.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((stat_io::process_io_write_second.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,s.syscw);
    }
  }
  if (stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

inline void stat_io() {
  static auto process_io_read_bytes_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_read_bytes_second");
  static auto process_io_write_bytes_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_write_bytes_second");
  static auto process_io_read_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_read_second");
  static auto process_io_write_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_write_second");

  ProcIO s{};
#if defined(__APPLE__)
#else
  auto stream_file =
      std::shared_ptr<FILE>(fopen("/proc/self/io", "r"), [](FILE *ptr) {
        fclose(ptr);
      });
  if (stream_file == nullptr) {
    return;
  }

  if (fscanf(stream_file.get(),
             "%*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu",
             &s.rchar, &s.wchar, &s.syscr, &s.syscw, &s.read_bytes,
             &s.write_bytes, &s.cancelled_write_bytes) != 7) {
    return;
  }
#endif

  process_io_read_bytes_second->update(s.rchar);
  process_io_write_bytes_second->update(s.wchar);
  process_io_read_second->update(s.syscr);
  process_io_write_second->update(s.syscw);
}